

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O0

double ClientUtils::ComponentSign(Enum i_Direction)

{
  double dStack_10;
  Enum i_Direction_local;
  
  if (i_Direction == Up) {
LAB_001bb3b9:
    dStack_10 = 1.0;
  }
  else {
    if (i_Direction != Down) {
      if (i_Direction == Left) goto LAB_001bb3b9;
      if (i_Direction != Right) {
        if (i_Direction == Forward) goto LAB_001bb3b9;
        if (i_Direction != Backward) {
          __assert_fail("!\"Unknown enum value\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCoreUtils/ClientUtils.cpp"
                        ,0x60,
                        "double ClientUtils::ComponentSign(ViconDataStreamSDK::Core::Direction::Enum)"
                       );
        }
      }
    }
    dStack_10 = -1.0;
  }
  return dStack_10;
}

Assistant:

double ComponentSign( ViconDataStreamSDK::Core::Direction::Enum i_Direction )
  {
    switch( i_Direction )
    {
    case ViconDataStreamSDK::Core::Direction::Forward :
    case ViconDataStreamSDK::Core::Direction::Left    :
    case ViconDataStreamSDK::Core::Direction::Up      : return 1.0;
    case ViconDataStreamSDK::Core::Direction::Backward:
    case ViconDataStreamSDK::Core::Direction::Right   :
    case ViconDataStreamSDK::Core::Direction::Down    : return -1.0;
    default                                           : assert( !"Unknown enum value" );
                                                        return 0.0;
    }
  }